

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_xz.c
# Opt level: O1

ssize_t xz_filter_read(archive_read_filter *self,void **p)

{
  size_t min;
  undefined8 *puVar1;
  bool bVar2;
  int iVar3;
  undefined4 uVar4;
  void *pvVar5;
  void *pvVar6;
  int *piVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  char *fmt;
  archive_read *a;
  ssize_t sVar11;
  long lVar12;
  ssize_t avail_in;
  uchar props [5];
  lzma_filter filters [2];
  ssize_t avail_in_1;
  long local_68;
  undefined1 local_5d;
  int local_5c;
  ssize_t local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  ssize_t local_38;
  
  puVar1 = (undefined8 *)self->data;
  lVar9 = puVar1[0x12];
  puVar1[3] = puVar1[0x11];
  puVar1[4] = lVar9;
  do {
    if ((lVar9 == 0) || (*(char *)(puVar1 + 0x14) != '\0')) {
      lVar12 = puVar1[3] - (long)puVar1[0x11];
      puVar1[0x13] = puVar1[0x13] + lVar12;
      puVar1[0x16] = puVar1[0x16] + lVar12;
      lVar9 = lVar12;
      if (lVar12 == 0) {
        *p = (void *)0x0;
      }
      else {
        *p = (void *)puVar1[0x11];
        if (self->code == 9) {
          uVar4 = lzma_crc32(puVar1[0x11],lVar12,*(undefined4 *)((long)puVar1 + 0xa4));
          *(undefined4 *)((long)puVar1 + 0xa4) = uVar4;
          if (*(char *)(puVar1 + 0x14) != '\0') {
            pvVar6 = self->data;
            min = (ulong)(*(char *)((long)pvVar6 + 0xa2) != '\0') * 8 + 0xc;
            piVar7 = (int *)__archive_read_filter_ahead(self->upstream,min,&local_58);
            lVar9 = -0x1e;
            if (piVar7 != (int *)0x0 || -1 < local_58) {
              if (local_58 < (long)min) {
                a = self->archive;
                fmt = "Lzip: Remaining data is less bytes";
              }
              else if (*(int *)((long)pvVar6 + 0xa4) == *piVar7) {
                if (*(long *)((long)pvVar6 + 0xb0) == *(long *)(piVar7 + 1)) {
                  if ((*(char *)((long)pvVar6 + 0xa2) != '\x01') ||
                     (*(long *)((long)pvVar6 + 0xa8) + min == *(long *)(piVar7 + 3))) {
                    __archive_read_filter_consume(self->upstream,min);
                    iVar3 = lzip_has_member(self->upstream);
                    if (iVar3 != 0) {
                      *(undefined2 *)((long)pvVar6 + 0xa0) = 0;
                      *(undefined8 *)((long)pvVar6 + 0xa4) = 0;
                      *(undefined8 *)((long)pvVar6 + 0xac) = 0;
                      *(undefined4 *)((long)pvVar6 + 0xb4) = 0;
                      return lVar12;
                    }
                    return lVar12;
                  }
                  a = self->archive;
                  fmt = "Lzip: Member size error";
                }
                else {
                  a = self->archive;
                  fmt = "Lzip: Uncompressed size error";
                }
              }
              else {
                a = self->archive;
                fmt = "Lzip: CRC32 error";
              }
              archive_set_error(&a->archive,-1,fmt);
              lVar9 = -0x19;
            }
          }
        }
      }
      return lVar9;
    }
    if (*(char *)((long)puVar1 + 0xa1) == '\0') {
      pvVar6 = self->data;
      pvVar5 = __archive_read_filter_ahead(self->upstream,6,&local_38);
      sVar11 = -0x1e;
      if (pvVar5 == (void *)0x0) {
LAB_0010bf32:
        bVar2 = false;
      }
      else {
        *(undefined1 *)((long)pvVar6 + 0xa2) = *(undefined1 *)((long)pvVar5 + 4);
        local_5d = 0x5d;
        uVar8 = *(byte *)((long)pvVar5 + 5) & 0x1f;
        if (uVar8 - 0x1c < 0xfffffff0) goto LAB_0010bf32;
        uVar10 = 1 << (sbyte)uVar8;
        local_5c = (uint)(*(byte *)((long)pvVar5 + 5) >> 5) * (uVar10 >> 4);
        if (uVar8 < 0xd) {
          local_5c = 0;
        }
        local_5c = uVar10 - local_5c;
        __archive_read_filter_consume(self->upstream,6);
        *(undefined8 *)((long)pvVar6 + 0xa8) = 6;
        local_58 = 0x4000000000000001;
        local_50 = 0;
        local_48 = 0xffffffffffffffff;
        local_40 = 0;
        iVar3 = lzma_properties_decode(&local_58,0,&local_5d,5);
        if ((iVar3 == 0) && (iVar3 = lzma_raw_decoder(pvVar6,&local_58), iVar3 == 0)) {
          bVar2 = true;
          sVar11 = 0;
        }
        else {
          set_error(self,iVar3);
          bVar2 = false;
        }
      }
      if (!bVar2) {
        return sVar11;
      }
      *(undefined1 *)((long)puVar1 + 0xa1) = 1;
    }
    pvVar6 = __archive_read_filter_ahead(self->upstream,1,&local_68);
    *puVar1 = pvVar6;
    if (local_68 < 0 && pvVar6 == (void *)0x0) {
      archive_set_error(&self->archive->archive,-1,"truncated input");
      return -0x1e;
    }
    puVar1[1] = local_68;
    iVar3 = lzma_code(puVar1,(local_68 == 0) * '\x03');
    if (iVar3 != 0) {
      if (iVar3 != 1) {
        set_error(self,iVar3);
        return -0x1e;
      }
      *(undefined1 *)(puVar1 + 0x14) = 1;
    }
    __archive_read_filter_consume(self->upstream,local_68 - puVar1[1]);
    puVar1[0x15] = puVar1[0x15] + (local_68 - puVar1[1]);
    lVar9 = puVar1[4];
  } while( true );
}

Assistant:

static ssize_t
xz_filter_read(struct archive_read_filter *self, const void **p)
{
	struct private_data *state;
	size_t decompressed;
	ssize_t avail_in;
	int ret;

	state = (struct private_data *)self->data;

	/* Empty our output buffer. */
	state->stream.next_out = state->out_block;
	state->stream.avail_out = state->out_block_size;

	/* Try to fill the output buffer. */
	while (state->stream.avail_out > 0 && !state->eof) {
		if (!state->in_stream) {
			/*
			 * Initialize liblzma for lzip
			 */
			ret = lzip_init(self);
			if (ret != ARCHIVE_OK)
				return (ret);
			state->in_stream = 1;
		}
		state->stream.next_in =
		    __archive_read_filter_ahead(self->upstream, 1, &avail_in);
		if (state->stream.next_in == NULL && avail_in < 0) {
			archive_set_error(&self->archive->archive,
			    ARCHIVE_ERRNO_MISC,
			    "truncated input");
			return (ARCHIVE_FATAL);
		}
		state->stream.avail_in = avail_in;

		/* Decompress as much as we can in one pass. */
		ret = lzma_code(&(state->stream),
		    (state->stream.avail_in == 0)? LZMA_FINISH: LZMA_RUN);
		switch (ret) {
		case LZMA_STREAM_END: /* Found end of stream. */
			state->eof = 1;
			/* FALL THROUGH */
		case LZMA_OK: /* Decompressor made some progress. */
			__archive_read_filter_consume(self->upstream,
			    avail_in - state->stream.avail_in);
			state->member_in +=
			    avail_in - state->stream.avail_in;
			break;
		default:
			set_error(self, ret);
			return (ARCHIVE_FATAL);
		}
	}

	decompressed = state->stream.next_out - state->out_block;
	state->total_out += decompressed;
	state->member_out += decompressed;
	if (decompressed == 0)
		*p = NULL;
	else {
		*p = state->out_block;
		if (self->code == ARCHIVE_FILTER_LZIP) {
			state->crc32 = lzma_crc32(state->out_block,
			    decompressed, state->crc32);
			if (state->eof) {
				ret = lzip_tail(self);
				if (ret != ARCHIVE_OK)
					return (ret);
			}
		}
	}
	return (decompressed);
}